

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O2

void __thiscall KDReports::Test::testSingleHeader(Test *this)

{
  char cVar1;
  void *t2;
  void *pvVar2;
  int iVar3;
  bool bVar4;
  Report report;
  long local_18;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  t2 = (void *)KDReports::Report::header(&report,6);
  if (*(long *)(local_18 + 0x78) == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = *(long *)(*(long *)(local_18 + 0x78) + 0x30) != 0;
  }
  cVar1 = QTest::qVerify(bVar4,"!headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x29);
  if (cVar1 != '\0') {
    iVar3 = (int)local_18 + 0x78;
    pvVar2 = (void *)KDReports::HeaderMap::headerForPage(iVar3,1);
    bVar4 = QTest::compare_ptr_helper
                      (pvVar2,t2,"headers.headerForPage(1, 2)","&theHeader",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x2a);
    if (bVar4) {
      pvVar2 = (void *)KDReports::HeaderMap::headerForPage(iVar3,2);
      QTest::compare_ptr_helper
                (pvVar2,t2,"headers.headerForPage(2, 2)","&theHeader",
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                 ,0x2b);
    }
  }
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testSingleHeader()
    {
        Report report;
        Header &theHeader = report.header();
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(!headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 2), &theHeader);
        QCOMPARE(headers.headerForPage(2, 2), &theHeader);
    }